

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

string * __thiscall pbrt::SimplePathIntegrator::ToString_abi_cxx11_(SimplePathIntegrator *this)

{
  string *in_RDI;
  bool *in_stack_00000010;
  bool *in_stack_00000018;
  int *in_stack_00000020;
  char *in_stack_00000028;
  
  StringPrintf<int_const&,bool_const&,bool_const&>
            (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010);
  return in_RDI;
}

Assistant:

std::string SimplePathIntegrator::ToString() const {
    return StringPrintf("[ SimplePathIntegrator maxDepth: %d sampleLights: %s "
                        "sampleBSDF: %s ]",
                        maxDepth, sampleLights, sampleBSDF);
}